

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O1

int anon_unknown.dwarf_26359::ChannelOut_noteoff(lua_State *L)

{
  undefined8 in_RAX;
  long *plVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  plVar1 = (long *)luaL_checkudata(L,1,"luartmidi.channelout");
  uVar2 = luaL_checkinteger(L,2);
  uVar3 = luaL_optinteger(L,3,0);
  if (0x7f < uVar2) {
    luaL_argerror(L,2,"Pitch must be between 0 and 127");
  }
  if (0x7f < uVar3) {
    luaL_argerror(L,3,"Velocity must be between 0 and 127");
  }
  uStack_28 = CONCAT17((char)uVar3,
                       CONCAT16((char)uVar2,CONCAT15((char)plVar1[1] + -0x80,(undefined5)uStack_28))
                      );
  (**(code **)(**(long **)(*plVar1 + 8) + 0x58))(*(long **)(*plVar1 + 8),(long)&uStack_28 + 5,3);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_noteoff(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	lua_Integer pitch = luaL_checkinteger(L, 2);
	lua_Integer velocity = luaL_optinteger(L, 3, 0);

	luaL_argcheck(L, pitch >= 0 && pitch <= 0x7F, 2, "Pitch must be between 0 and 127");
	luaL_argcheck(L, velocity >= 0 && velocity <= 0x7F, 3, "Velocity must be between 0 and 127");

	self.send(0x80 + self.index, pitch, velocity);
	lua_settop(L, 1);
	return 1;
}